

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/command_line_interface.cc:1276:16)>_>
::Visit<>(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_compiler_command_line_interface_cc:1276:16)>_>
          *this,FieldDescriptor *descriptor)

{
  ErrorPrinter *pEVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined1 *puVar5;
  ErrorCollector *pEVar6;
  string error;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  undefined8 local_a8;
  undefined8 uStack_a0;
  char local_98 [32];
  long local_78;
  char *local_70;
  char local_68 [32];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  char *local_30;
  
  if (*(int *)(descriptor + 4) - 19000U < 1000) {
    *(this->visitor).super_anon_class_16_2_e739539f.validation_error = true;
    local_e0 = 0;
    local_d8 = 0;
    local_e8 = &local_d8;
    local_a8 = absl::lts_20240722::numbers_internal::FastIntToBuffer(19000,local_98);
    local_a8 = local_a8 - (long)local_98;
    uStack_a0 = local_98;
    local_78 = absl::lts_20240722::numbers_internal::FastIntToBuffer(19999,local_68);
    local_78 = local_78 - (long)local_68;
    local_c0 = 0;
    local_b8 = 0;
    local_48 = (undefined4)local_a8;
    uStack_44 = local_a8._4_4_;
    uStack_40 = (undefined4)uStack_a0;
    uStack_3c = uStack_a0._4_4_;
    local_c8 = &local_b8;
    local_70 = local_68;
    local_38 = local_78;
    local_30 = local_68;
    absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
              (&local_c8,0x58,
               "Field numbers $0 through $1 are reserved for the protocol buffer library implementation."
               ,&local_48,2);
    std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_c8);
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
    }
    pEVar1 = (((this->visitor).super_anon_class_16_2_e739539f.error_collector)->_M_t).
             super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
             .
             super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_false>
             ._M_head_impl;
    pEVar6 = &pEVar1->super_ErrorCollector;
    if (pEVar1 == (ErrorPrinter *)0x0) {
      pEVar6 = (ErrorCollector *)0x0;
    }
    local_a8 = local_e0;
    uVar3 = local_a8;
    uStack_a0 = local_e8;
    puVar5 = uStack_a0;
    local_a8._0_4_ = (undefined4)local_e0;
    uVar2 = (undefined4)local_a8;
    uStack_a0._0_4_ = SUB84(local_e8,0);
    uVar4 = (undefined4)uStack_a0;
    local_a8 = uVar3;
    uStack_a0 = puVar5;
    (**(code **)(*(long *)pEVar6 + 0x10))
              (pEVar6,(*(undefined8 **)(*(long *)(descriptor + 0x10) + 8))[1],
               **(undefined8 **)(*(long *)(descriptor + 0x10) + 8),
               *(undefined8 *)(*(long *)(descriptor + 8) + 0x28),
               *(undefined8 *)(*(long *)(descriptor + 8) + 0x20),0,1,uVar2,uVar4);
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) + 1);
    }
  }
  return;
}

Assistant:

void Visit(const FieldDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
  }